

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdUtils.c
# Opt level: O1

int CmdCommandPrintCompare(Abc_Command **ppC1,Abc_Command **ppC2)

{
  char cVar1;
  Abc_Command *pAVar2;
  Abc_Command *pAVar3;
  char *__s1;
  int iVar4;
  int iVar5;
  
  pAVar2 = *ppC1;
  pAVar3 = *ppC2;
  iVar4 = strcmp(pAVar2->sGroup,pAVar3->sGroup);
  iVar5 = -1;
  if (iVar4 < 0) {
    return -1;
  }
  if (iVar4 == 0) {
    __s1 = pAVar2->sName;
    cVar1 = *__s1;
    if (cVar1 == '_') {
LAB_002c00f5:
      if (*pAVar3->sName != '_') goto LAB_002c00df;
    }
    else {
      if (*pAVar3->sName == '_') {
        return -1;
      }
      if (cVar1 == '_') goto LAB_002c00f5;
    }
    iVar4 = strcmp(__s1,pAVar3->sName);
    if ((-1 < iVar4) && (iVar5 = 1, iVar4 == 0)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cmd/cmdUtils.c"
                    ,0x2b3,"int CmdCommandPrintCompare(Abc_Command **, Abc_Command **)");
    }
  }
  else {
LAB_002c00df:
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int CmdCommandPrintCompare( Abc_Command ** ppC1, Abc_Command ** ppC2 )
{
    Abc_Command * pC1 = *ppC1;
    Abc_Command * pC2 = *ppC2;
    int RetValue;

    RetValue = strcmp( pC1->sGroup, pC2->sGroup );
    if ( RetValue < 0 )
        return -1;
    if ( RetValue > 0 )
        return 1;
    // the command belong to the same group

    // put commands with "_" at the end of the list
    if ( pC1->sName[0] != '_' && pC2->sName[0] == '_' )
        return -1;
    if ( pC1->sName[0] == '_' && pC2->sName[0] != '_' )
        return 1;

    RetValue = strcmp( pC1->sName, pC2->sName );
    if ( RetValue < 0 )
        return -1;
    if ( RetValue > 0 )
        return 1;
     // should not be two indentical commands
    assert( 0 );
    return 0;
}